

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt.cc
# Opt level: O2

opt_t * __thiscall re2c::opt_t::operator=(opt_t *this,opt_t *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  
  this->target = opt->target;
  this->bNoGenerationDate = opt->bNoGenerationDate;
  this->version = opt->version;
  this->encoding = opt->encoding;
  this->bCaseInsensitive = opt->bCaseInsensitive;
  this->bCaseInverted = opt->bCaseInverted;
  this->empty_class_policy = opt->empty_class_policy;
  this->cFlag = opt->cFlag;
  this->tFlag = opt->tFlag;
  this->header_file = opt->header_file;
  std::__cxx11::string::_M_assign((string *)&this->yycondtype);
  std::__cxx11::string::_M_assign((string *)&this->cond_get);
  this->cond_get_naked = opt->cond_get_naked;
  std::__cxx11::string::_M_assign((string *)&this->cond_set);
  std::__cxx11::string::_M_assign((string *)&this->cond_set_arg);
  this->cond_set_naked = opt->cond_set_naked;
  std::__cxx11::string::_M_assign((string *)&this->yyctable);
  std::__cxx11::string::_M_assign((string *)&this->condPrefix);
  std::__cxx11::string::_M_assign((string *)&this->condEnumPrefix);
  std::__cxx11::string::_M_assign((string *)&this->condDivider);
  std::__cxx11::string::_M_assign((string *)&this->condDividerParam);
  std::__cxx11::string::_M_assign((string *)&this->condGoto);
  std::__cxx11::string::_M_assign((string *)&this->condGotoParam);
  this->fFlag = opt->fFlag;
  std::__cxx11::string::_M_assign((string *)&this->state_get);
  this->state_get_naked = opt->state_get_naked;
  std::__cxx11::string::_M_assign((string *)&this->state_set);
  std::__cxx11::string::_M_assign((string *)&this->state_set_arg);
  this->state_set_naked = opt->state_set_naked;
  std::__cxx11::string::_M_assign((string *)&this->yyfilllabel);
  std::__cxx11::string::_M_assign((string *)&this->yynext);
  std::__cxx11::string::_M_assign((string *)&this->yyaccept);
  bVar1 = opt->bUseStateNext;
  bVar2 = opt->rFlag;
  bVar3 = opt->FFlag;
  this->bUseStateAbort = opt->bUseStateAbort;
  this->bUseStateNext = bVar1;
  this->rFlag = bVar2;
  this->FFlag = bVar3;
  this->sFlag = opt->sFlag;
  this->bFlag = opt->bFlag;
  std::__cxx11::string::_M_assign((string *)&this->yybm);
  this->yybmHexTable = opt->yybmHexTable;
  this->gFlag = opt->gFlag;
  std::__cxx11::string::_M_assign((string *)&this->yytarget);
  uVar4 = opt->topIndent;
  this->cGotoThreshold = opt->cGotoThreshold;
  this->topIndent = uVar4;
  std::__cxx11::string::_M_assign((string *)&this->indString);
  (this->input_api).type_ = (opt->input_api).type_;
  std::__cxx11::string::_M_assign((string *)&this->yycursor);
  std::__cxx11::string::_M_assign((string *)&this->yymarker);
  std::__cxx11::string::_M_assign((string *)&this->yyctxmarker);
  std::__cxx11::string::_M_assign((string *)&this->yylimit);
  std::__cxx11::string::_M_assign((string *)&this->yypeek);
  std::__cxx11::string::_M_assign((string *)&this->yyskip);
  std::__cxx11::string::_M_assign((string *)&this->yybackup);
  std::__cxx11::string::_M_assign((string *)&this->yybackupctx);
  std::__cxx11::string::_M_assign((string *)&this->yyrestore);
  std::__cxx11::string::_M_assign((string *)&this->yyrestorectx);
  std::__cxx11::string::_M_assign((string *)&this->yylessthan);
  this->iFlag = opt->iFlag;
  this->dFlag = opt->dFlag;
  std::__cxx11::string::_M_assign((string *)&this->yydebug);
  std::__cxx11::string::_M_assign((string *)&this->yyctype);
  std::__cxx11::string::_M_assign((string *)&this->yych);
  this->bEmitYYCh = opt->bEmitYYCh;
  this->yychConversion = opt->yychConversion;
  std::__cxx11::string::_M_assign((string *)&this->fill);
  this->fill_use = opt->fill_use;
  this->fill_check = opt->fill_check;
  std::__cxx11::string::_M_assign((string *)&this->fill_arg);
  this->fill_arg_use = opt->fill_arg_use;
  this->fill_naked = opt->fill_naked;
  std::__cxx11::string::_M_assign((string *)&this->labelPrefix);
  this->dfa_minimization = opt->dfa_minimization;
  return this;
}

Assistant:

opt_t & opt_t::operator = (const opt_t & opt)
{
#define OPT1 OPT
#define OPT(type, name, value) name = opt.name;
	RE2C_OPTS
#undef OPT1
#undef OPT
	return *this;
}